

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopGetIthCareLit(char *pSop,int i)

{
  int iVar1;
  char *pcStack_28;
  int nVars;
  char *pCube;
  int i_local;
  char *pSop_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  pcStack_28 = pSop;
  while( true ) {
    if (*pcStack_28 == '\0') {
      return -1;
    }
    if (pcStack_28[i] != '-') break;
    pcStack_28 = pcStack_28 + (iVar1 + 3);
  }
  return pcStack_28[i] + -0x30;
}

Assistant:

int Abc_SopGetIthCareLit( char * pSop, int i )
{
    char * pCube;
    int nVars;
    nVars = Abc_SopGetVarNum( pSop );
    Abc_SopForEachCube( pSop, nVars, pCube )
        if ( pCube[i] != '-' )
            return pCube[i] - '0';
    return -1;
}